

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertNodes
          (FBXConverter *this,uint64_t id,aiNode *parent,aiMatrix4x4 *parent_transform)

{
  float fVar1;
  bool bVar2;
  Object *pOVar3;
  Model *pMVar4;
  aiNode *paVar5;
  aiNode **ppaVar6;
  aiNode **ppaVar7;
  aiNode *paVar8;
  undefined1 auVar9 [8];
  ulong uVar10;
  pointer ppCVar11;
  pointer ppaVar12;
  ulong __n;
  pointer ppCVar13;
  pointer ppaVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> post_nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  string unique_name;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_19c;
  aiMatrix4x4 local_198;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [8];
  aiNode **ppaStack_f0;
  aiNode **local_e8;
  Model *local_e0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_d8;
  aiNode *local_b8;
  float local_b0;
  float local_ac;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_a8;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_90
  ;
  pointer local_78;
  aiMatrix4x4 *local_70;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_68
  ;
  string local_50;
  
  local_b8 = (aiNode *)this;
  local_70 = parent_transform;
  Document::GetConnectionsByDestinationSequenced(&local_68,this->doc,id,"Model");
  local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (aiNode **)0x0;
  local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiNode **)0x0;
  local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiNode **)0x0;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
            (&local_a8,
             (long)local_68.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_f8 = (undefined1  [8])0x0;
  ppaStack_f0 = (aiNode **)0x0;
  local_e8 = (aiNode **)0x0;
  local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_68.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78 = local_68.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    paVar8 = local_b8;
    ppCVar11 = local_68.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppCVar13 = local_68.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((*ppCVar13)->prop)._M_string_length == 0) {
        pOVar3 = Connection::SourceObject(*ppCVar13);
        if (pOVar3 == (Object *)0x0) {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x17059f);
        }
        else {
          pMVar4 = (Model *)__dynamic_cast(pOVar3,&Object::typeinfo,&Model::typeinfo,0);
          local_e0 = pMVar4;
          if (pMVar4 != (Model *)0x0) {
            if ((undefined1  [8])ppaStack_f0 != local_f8) {
              ppaStack_f0 = (aiNode **)local_f8;
            }
            if (local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            local_198.a1 = local_70->a1;
            local_198.a2 = local_70->a2;
            local_198.a3 = local_70->a3;
            local_198.a4 = local_70->a4;
            local_198.b1 = local_70->b1;
            local_198.b2 = local_70->b2;
            local_198.b3 = local_70->b3;
            local_198.b4 = local_70->b4;
            local_198.c1 = local_70->c1;
            local_198.c2 = local_70->c2;
            local_198.c3 = local_70->c3;
            local_198.c4 = local_70->c4;
            local_198.d1 = local_70->d1;
            local_198.d2 = local_70->d2;
            local_198.d3 = local_70->d3;
            local_198.d4 = local_70->d4;
            MakeUniqueNodeName_abi_cxx11_(&local_50,(FBXConverter *)paVar8,pMVar4,parent);
            bVar2 = GenerateTransformationNodeChain
                              ((FBXConverter *)paVar8,pMVar4,&local_50,
                               (vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_f8,&local_d8);
            if ((undefined1  [8])ppaStack_f0 == local_f8) {
              __assert_fail("nodes_chain.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xde,
                            "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                           );
            }
            if (bVar2) {
              paVar5 = (aiNode *)operator_new(0x478);
              paVar8 = paVar5;
              aiNode::aiNode(paVar5,&local_50);
              local_90.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar5;
              if (ppaStack_f0 == local_e8) {
                paVar8 = (aiNode *)local_f8;
                std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)paVar8,(iterator)ppaStack_f0,
                           (aiNode **)&local_90);
              }
              else {
                *ppaStack_f0 = paVar5;
                ppaStack_f0 = ppaStack_f0 + 1;
              }
            }
            SetupNodeMetadata((FBXConverter *)paVar8,pMVar4,ppaStack_f0[-1]);
            ppaVar7 = ppaStack_f0;
            paVar5 = parent;
            local_1d0 = local_198.a1;
            if (local_f8 != (undefined1  [8])ppaStack_f0) {
              local_1c8 = local_198.a2;
              local_1bc = local_198.a3;
              local_1c4 = local_198.b1;
              local_1cc = local_198.b2;
              local_1c0 = local_198.d3;
              paVar8 = parent;
              auVar9 = local_f8;
              fVar25 = local_198.b4;
              fVar34 = local_198.c4;
              fVar18 = local_198.c3;
              fVar21 = local_198.d4;
              fVar23 = local_198.d2;
              fVar24 = local_198.a4;
              fVar31 = local_198.c1;
              fVar32 = local_198.c2;
              fVar30 = local_198.b3;
              fVar15 = local_198.d1;
              do {
                paVar5 = *(aiNode **)auVar9;
                if (paVar5 == (aiNode *)0x0) {
                  local_198.a1 = local_1d0;
                  __assert_fail("prenode",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                                ,0xea,
                                "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                               );
                }
                local_100 = fVar21;
                local_fc = fVar34;
                if (paVar8 != parent) {
                  paVar8->mNumChildren = 1;
                  ppaVar6 = (aiNode **)operator_new__(8);
                  paVar8->mChildren = ppaVar6;
                  *ppaVar6 = paVar5;
                }
                paVar5->mParent = paVar8;
                local_13c = (paVar5->mTransformation).b1;
                fVar34 = (paVar5->mTransformation).a1;
                fVar21 = (paVar5->mTransformation).c1;
                local_11c = (paVar5->mTransformation).a2;
                fVar26 = local_11c * local_1d0;
                local_120 = (paVar5->mTransformation).a3;
                fVar17 = local_120 * local_1d0;
                local_124 = (paVar5->mTransformation).a4;
                fVar35 = local_1d0 * local_124;
                local_104 = local_11c * local_1c4;
                local_108 = local_120 * local_1c4;
                fVar36 = local_1c4 * local_124;
                local_10c = fVar34 * fVar31;
                local_110 = local_11c * fVar31;
                local_114 = local_120 * fVar31;
                fVar20 = fVar31 * local_124;
                local_118 = fVar34 * fVar15;
                local_11c = local_11c * fVar15;
                local_120 = local_120 * fVar15;
                local_124 = local_124 * fVar15;
                local_140 = (paVar5->mTransformation).d1;
                local_1d0 = local_140 * fVar24 +
                            fVar21 * local_1bc + fVar34 * local_1d0 + local_13c * local_1c8;
                fVar31 = (paVar5->mTransformation).b2;
                fVar1 = (paVar5->mTransformation).c2;
                local_134 = (paVar5->mTransformation).b3;
                fVar15 = local_1c8 * local_134;
                local_130 = (paVar5->mTransformation).b4;
                fVar29 = local_1c8 * local_130;
                local_ac = local_13c * local_1cc;
                local_154 = fVar31 * local_1cc;
                local_150 = local_134 * local_1cc;
                fVar27 = local_1cc * local_130;
                local_14c = local_13c * fVar32;
                local_148 = fVar31 * fVar32;
                local_144 = local_134 * fVar32;
                fVar19 = fVar32 * local_130;
                local_13c = local_13c * fVar23;
                local_138 = fVar31 * fVar23;
                local_134 = local_134 * fVar23;
                local_130 = local_130 * fVar23;
                fVar23 = (paVar5->mTransformation).d2;
                local_1c8 = fVar23 * fVar24 + fVar1 * local_1bc + fVar26 + local_1c8 * fVar31;
                fVar26 = (paVar5->mTransformation).c3;
                fVar16 = (paVar5->mTransformation).c4;
                fVar31 = local_1bc * fVar16;
                fVar32 = fVar30 * fVar16;
                local_b0 = fVar26 * fVar18;
                fVar22 = fVar18 * fVar16;
                fVar16 = fVar16 * local_1c0;
                fVar28 = (paVar5->mTransformation).d3;
                local_1bc = fVar28 * fVar24 + fVar26 * local_1bc + fVar17 + fVar15;
                fVar17 = (paVar5->mTransformation).d4;
                fVar24 = fVar24 * fVar17 + fVar31 + fVar35 + fVar29;
                local_1c4 = local_140 * fVar25 + fVar21 * fVar30 + fVar34 * local_1c4 + local_ac;
                local_1cc = fVar23 * fVar25 + fVar1 * fVar30 + local_104 + local_154;
                fVar30 = fVar28 * fVar25 + fVar26 * fVar30 + local_108 + local_150;
                fVar25 = fVar25 * fVar17 + fVar32 + fVar36 + fVar27;
                fVar31 = local_140 * local_fc + fVar21 * fVar18 + local_10c + local_14c;
                fVar32 = fVar23 * local_fc + fVar1 * fVar18 + local_110 + local_148;
                fVar18 = fVar28 * local_fc + local_b0 + local_114 + local_144;
                fVar34 = local_fc * fVar17 + fVar22 + fVar20 + fVar19;
                fVar15 = local_140 * local_100 + fVar21 * local_1c0 + local_118 + local_13c;
                fVar23 = fVar23 * local_100 + fVar1 * local_1c0 + local_11c + local_138;
                local_1c0 = fVar28 * local_100 + fVar26 * local_1c0 + local_120 + local_134;
                fVar21 = fVar17 * local_100 + fVar16 + local_124 + local_130;
                local_198.a2 = local_1c8;
                local_198.a4 = fVar24;
                local_198.a3 = local_1bc;
                local_198.b2 = local_1cc;
                local_198.b1 = local_1c4;
                local_198.b4 = fVar25;
                local_198.b3 = fVar30;
                local_198.c2 = fVar32;
                local_198.c1 = fVar31;
                local_198.c4 = fVar34;
                local_198.c3 = fVar18;
                local_198.d2 = fVar23;
                local_198.d1 = fVar15;
                local_198.d4 = fVar21;
                local_198.d3 = local_1c0;
                auVar9 = (undefined1  [8])((long)auVar9 + 8);
                paVar8 = paVar5;
                local_12c = local_1c8;
                local_128 = local_1d0;
              } while (auVar9 != (undefined1  [8])ppaVar7);
            }
            paVar8 = local_b8;
            pMVar4 = local_e0;
            local_198.a1 = local_1d0;
            ConvertModel((FBXConverter *)local_b8,local_e0,ppaVar7[-1],&local_198);
            Document::GetConnectionsByDestinationSequenced
                      (&local_90,*(Document **)((paVar8->mName).data + 0x19c),
                       (pMVar4->super_Object).id,"Model");
            ppaVar14 = local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (local_90.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_90.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::
              for_each<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,Assimp::FBX::Util::delete_fun<aiNode>>
                        (local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            else if (local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                     local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
              local_1c8 = local_198.a1;
              local_1c4 = local_198.a2;
              local_1bc = local_198.a3;
              local_1d0 = local_198.b1;
              local_1cc = local_198.b2;
              local_19c = local_198.d2;
              local_1c0 = local_198.d3;
              paVar8 = paVar5;
              ppaVar12 = local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              fVar25 = local_198.b4;
              fVar34 = local_198.c4;
              fVar18 = local_198.d4;
              fVar21 = local_198.a4;
              fVar23 = local_198.c2;
              fVar24 = local_198.b3;
              fVar31 = local_198.c3;
              fVar32 = local_198.c1;
              fVar30 = local_198.d1;
              do {
                paVar5 = *ppaVar12;
                if (paVar5 == (aiNode *)0x0) {
                  __assert_fail("postnode",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                                ,0x103,
                                "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                               );
                }
                local_100 = fVar18;
                local_fc = fVar34;
                if (paVar8 != parent) {
                  paVar8->mNumChildren = 1;
                  ppaVar7 = (aiNode **)operator_new__(8);
                  paVar8->mChildren = ppaVar7;
                  *ppaVar7 = paVar5;
                }
                paVar5->mParent = paVar8;
                fVar34 = (paVar5->mTransformation).b1;
                fVar18 = (paVar5->mTransformation).a1;
                fVar15 = (paVar5->mTransformation).c1;
                local_120 = (paVar5->mTransformation).a2;
                fVar28 = local_120 * local_1c8;
                local_124 = (paVar5->mTransformation).a3;
                fVar19 = local_124 * local_1c8;
                local_12c = (paVar5->mTransformation).a4;
                fVar29 = local_1c8 * local_12c;
                local_104 = fVar18 * local_1d0;
                local_108 = local_120 * local_1d0;
                local_10c = local_124 * local_1d0;
                fVar35 = local_1d0 * local_12c;
                local_110 = fVar18 * fVar32;
                local_114 = local_120 * fVar32;
                local_118 = local_124 * fVar32;
                fVar20 = fVar32 * local_12c;
                local_11c = fVar18 * fVar30;
                local_120 = local_120 * fVar30;
                local_124 = local_124 * fVar30;
                local_12c = local_12c * fVar30;
                local_140 = (paVar5->mTransformation).d1;
                local_1c8 = local_140 * fVar21 +
                            fVar15 * local_1bc + fVar18 * local_1c8 + fVar34 * local_1c4;
                fVar18 = (paVar5->mTransformation).b2;
                fVar1 = (paVar5->mTransformation).c2;
                local_134 = (paVar5->mTransformation).b3;
                fVar32 = local_1c4 * local_134;
                fVar26 = (paVar5->mTransformation).b4;
                fVar33 = local_1c4 * fVar26;
                local_154 = fVar18 * local_1cc;
                local_150 = local_134 * local_1cc;
                fVar36 = local_1cc * fVar26;
                local_14c = fVar34 * fVar23;
                local_148 = fVar18 * fVar23;
                local_144 = local_134 * fVar23;
                fVar22 = fVar23 * fVar26;
                local_13c = fVar34 * local_19c;
                local_138 = fVar18 * local_19c;
                local_134 = local_134 * local_19c;
                fVar26 = fVar26 * local_19c;
                fVar16 = (paVar5->mTransformation).d2;
                local_1c4 = fVar16 * fVar21 + fVar1 * local_1bc + fVar28 + local_1c4 * fVar18;
                fVar18 = (paVar5->mTransformation).c3;
                fVar28 = (paVar5->mTransformation).c4;
                fVar27 = local_1bc * fVar28;
                fVar23 = fVar24 * fVar28;
                fVar30 = fVar31 * fVar28;
                fVar28 = fVar28 * local_1c0;
                fVar17 = (paVar5->mTransformation).d3;
                local_1bc = fVar17 * fVar21 + fVar18 * local_1bc + fVar19 + fVar32;
                fVar19 = (paVar5->mTransformation).d4;
                fVar21 = fVar21 * fVar19 + fVar27 + fVar29 + fVar33;
                local_1d0 = local_140 * fVar25 + fVar15 * fVar24 + local_104 + fVar34 * local_1cc;
                local_1cc = fVar16 * fVar25 + fVar1 * fVar24 + local_108 + local_154;
                fVar24 = fVar17 * fVar25 + fVar18 * fVar24 + local_10c + local_150;
                fVar25 = fVar25 * fVar19 + fVar23 + fVar35 + fVar36;
                fVar32 = local_140 * local_fc + fVar15 * fVar31 + local_110 + local_14c;
                fVar23 = fVar16 * local_fc + fVar1 * fVar31 + local_114 + local_148;
                fVar31 = fVar17 * local_fc + fVar18 * fVar31 + local_118 + local_144;
                fVar34 = local_fc * fVar19 + fVar30 + fVar20 + fVar22;
                fVar30 = local_140 * local_100 + fVar15 * local_1c0 + local_11c + local_13c;
                local_19c = fVar16 * local_100 + fVar1 * local_1c0 + local_120 + local_138;
                local_1c0 = fVar17 * local_100 + fVar18 * local_1c0 + local_124 + local_134;
                fVar18 = fVar19 * local_100 + fVar28 + local_12c + fVar26;
                local_198.a2 = local_1c4;
                local_198.a1 = local_1c8;
                local_198.a4 = fVar21;
                local_198.a3 = local_1bc;
                local_198.b2 = local_1cc;
                local_198.b1 = local_1d0;
                local_198.b4 = fVar25;
                local_198.b3 = fVar24;
                local_198.c2 = fVar23;
                local_198.c1 = fVar32;
                local_198.c4 = fVar34;
                local_198.c3 = fVar31;
                local_198.d2 = local_19c;
                local_198.d1 = fVar30;
                local_198.d4 = fVar18;
                local_198.d3 = local_1c0;
                ppaVar12 = ppaVar12 + 1;
                paVar8 = paVar5;
                local_130 = local_1c4;
                local_128 = local_1c8;
              } while (ppaVar12 != ppaVar14);
            }
            paVar8 = local_b8;
            ConvertNodes((FBXConverter *)local_b8,(local_e0->super_Object).id,paVar5,&local_198);
            ppCVar11 = local_78;
            if (*(char *)(**(long **)((paVar8->mName).data + 0x19c) + 6) == '\x01') {
              ConvertLights((FBXConverter *)paVar8,local_e0,&local_50);
            }
            if (*(char *)(**(long **)((paVar8->mName).data + 0x19c) + 5) == '\x01') {
              ConvertCameras((FBXConverter *)paVar8,local_e0,&local_50);
            }
            if (local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_a8,
                         (iterator)
                         local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,(aiNode **)local_f8);
            }
            else {
              *local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish = *(aiNode **)local_f8;
              local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if ((undefined1  [8])ppaStack_f0 != local_f8) {
              ppaStack_f0 = (aiNode **)local_f8;
            }
            if ((aiNode *)
                local_90.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (aiNode *)0x0) {
              operator_delete(local_90.
                              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
        }
      }
      ppCVar13 = ppCVar13 + 1;
    } while (ppCVar13 != ppCVar11);
  }
  ppaVar12 = local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppaVar14 = local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar10 = (long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    __n = -(ulong)(uVar10 >> 0x3d != 0) |
          (long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    ppaVar7 = (aiNode **)operator_new__(__n);
    memset(ppaVar7,0,__n);
    parent->mChildren = ppaVar7;
    parent->mNumChildren = (uint)uVar10;
    for (; ppaVar14 != ppaVar12; ppaVar14 = ppaVar14 + 1) {
      paVar8 = *ppaVar14;
      *ppaVar14 = *ppaVar7;
      *ppaVar7 = paVar8;
      ppaVar7 = ppaVar7 + 1;
    }
  }
  if (local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8);
  }
  if (local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (aiNode **)0x0) {
    operator_delete(local_a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertNodes(uint64_t id, aiNode& parent, const aiMatrix4x4& parent_transform) {
            const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(id, "Model");

            std::vector<aiNode*> nodes;
            nodes.reserve(conns.size());

            std::vector<aiNode*> nodes_chain;
            std::vector<aiNode*> post_nodes_chain;

            try {
                for (const Connection* con : conns) {

                    // ignore object-property links
                    if (con->PropertyName().length()) {
                        continue;
                    }

                    const Object* const object = con->SourceObject();
                    if (nullptr == object) {
                        FBXImporter::LogWarn("failed to convert source object for Model link");
                        continue;
                    }

                    const Model* const model = dynamic_cast<const Model*>(object);

                    if (nullptr != model) {
                        nodes_chain.clear();
                        post_nodes_chain.clear();

                        aiMatrix4x4 new_abs_transform = parent_transform;

                        std::string unique_name = MakeUniqueNodeName(model, parent);

                        // even though there is only a single input node, the design of
                        // assimp (or rather: the complicated transformation chain that
                        // is employed by fbx) means that we may need multiple aiNode's
                        // to represent a fbx node's transformation.
                        const bool need_additional_node = GenerateTransformationNodeChain(*model, unique_name, nodes_chain, post_nodes_chain);

                        ai_assert(nodes_chain.size());

                        if (need_additional_node) {
                            nodes_chain.push_back(new aiNode(unique_name));
                        }

                        //setup metadata on newest node
                        SetupNodeMetadata(*model, *nodes_chain.back());

                        // link all nodes in a row
                        aiNode* last_parent = &parent;
                        for (aiNode* prenode : nodes_chain) {
                            ai_assert(prenode);

                            if (last_parent != &parent) {
                                last_parent->mNumChildren = 1;
                                last_parent->mChildren = new aiNode*[1];
                                last_parent->mChildren[0] = prenode;
                            }

                            prenode->mParent = last_parent;
                            last_parent = prenode;

                            new_abs_transform *= prenode->mTransformation;
                        }

                        // attach geometry
                        ConvertModel(*model, *nodes_chain.back(), new_abs_transform);

                        // check if there will be any child nodes
                        const std::vector<const Connection*>& child_conns
                            = doc.GetConnectionsByDestinationSequenced(model->ID(), "Model");

                        // if so, link the geometric transform inverse nodes
                        // before we attach any child nodes
                        if (child_conns.size()) {
                            for (aiNode* postnode : post_nodes_chain) {
                                ai_assert(postnode);

                                if (last_parent != &parent) {
                                    last_parent->mNumChildren = 1;
                                    last_parent->mChildren = new aiNode*[1];
                                    last_parent->mChildren[0] = postnode;
                                }

                                postnode->mParent = last_parent;
                                last_parent = postnode;

                                new_abs_transform *= postnode->mTransformation;
                            }
                        }
                        else {
                            // free the nodes we allocated as we don't need them
                            Util::delete_fun<aiNode> deleter;
                            std::for_each(
                                post_nodes_chain.begin(),
                                post_nodes_chain.end(),
                                deleter
                            );
                        }

                        // attach sub-nodes (if any)
                        ConvertNodes(model->ID(), *last_parent, new_abs_transform);

                        if (doc.Settings().readLights) {
                            ConvertLights(*model, unique_name);
                        }

                        if (doc.Settings().readCameras) {
                            ConvertCameras(*model, unique_name);
                        }

                        nodes.push_back(nodes_chain.front());
                        nodes_chain.clear();
                    }
                }

                if (nodes.size()) {
                    parent.mChildren = new aiNode*[nodes.size()]();
                    parent.mNumChildren = static_cast<unsigned int>(nodes.size());

                    std::swap_ranges(nodes.begin(), nodes.end(), parent.mChildren);
                }
            }
            catch (std::exception&) {
                Util::delete_fun<aiNode> deleter;
                std::for_each(nodes.begin(), nodes.end(), deleter);
                std::for_each(nodes_chain.begin(), nodes_chain.end(), deleter);
                std::for_each(post_nodes_chain.begin(), post_nodes_chain.end(), deleter);
            }
        }